

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

Int128 __thiscall btConvexHullInternal::Int128::operator*(Int128 *this,int64_t b)

{
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  Int128 IVar5;
  Int128 IVar6;
  
  uVar1 = this->high;
  if ((long)uVar1 < 0) {
    IVar5 = operator-(this);
  }
  else {
    IVar5.high = uVar1;
    IVar5.low = this->low;
  }
  uVar3 = -b;
  if (0 < b) {
    uVar3 = b;
  }
  IVar6 = mul(IVar5.low,uVar3);
  uVar2 = IVar6.low;
  uVar4 = uVar3 * IVar5.high + IVar6.high;
  uVar3 = uVar2;
  if ((long)(uVar1 ^ b) < 0) {
    uVar3 = -uVar2;
    uVar4 = ~uVar4 + (ulong)(uVar2 == 0);
  }
  IVar6.high = uVar4;
  IVar6.low = uVar3;
  return IVar6;
}

Assistant:

btConvexHullInternal::Int128 btConvexHullInternal::Int128::operator*(int64_t b) const
{
	bool negative = (int64_t) high < 0;
	Int128 a = negative ? -*this : *this;
	if (b < 0)
	{
		negative = !negative;
		b = -b;
	}
	Int128 result = mul(a.low, (uint64_t) b);
	result.high += a.high * (uint64_t) b;
	return negative ? -result : result;
}